

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_half_to_float_4chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint16_t uVar4;
  long *in_RDI;
  float fVar5;
  int x;
  float *out;
  int y;
  int linc0;
  int h;
  int w;
  uint8_t *out0;
  uint16_t *in3;
  uint16_t *in2;
  uint16_t *in1;
  uint16_t *in0;
  uint8_t *srcbuffer;
  int local_54;
  float *local_50;
  int local_48;
  float *local_38;
  
  iVar1 = *(int *)(*in_RDI + 0xc);
  iVar2 = *(int *)((long)in_RDI + 0x24);
  iVar3 = *(int *)(*in_RDI + 0x24);
  local_38 = *(float **)(*in_RDI + 0x28);
  for (local_48 = 0; local_48 < iVar2; local_48 = local_48 + 1) {
    local_50 = local_38;
    for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
      uVar4 = one_to_native16(0);
      fVar5 = half_to_float(uVar4);
      *local_50 = fVar5;
      uVar4 = one_to_native16(0);
      fVar5 = half_to_float(uVar4);
      local_50[1] = fVar5;
      uVar4 = one_to_native16(0);
      fVar5 = half_to_float(uVar4);
      local_50[2] = fVar5;
      uVar4 = one_to_native16(0);
      fVar5 = half_to_float(uVar4);
      local_50[3] = fVar5;
      local_50 = local_50 + 4;
    }
    local_38 = (float *)((long)local_38 + (long)iVar3);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_4chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;
        in0        = (const uint16_t*) srcbuffer;
        in1        = in0 + w;
        in2        = in1 + w;
        in3        = in2 + w;

        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in3[x]));
            out[1] = half_to_float (one_to_native16 (in2[x]));
            out[2] = half_to_float (one_to_native16 (in1[x]));
            out[3] = half_to_float (one_to_native16 (in0[x]));
            out += 4;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}